

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::V2MessageLite::_InternalSerialize
          (V2MessageLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int32_t value;
  V2EnumLite value_00;
  int size;
  uint32_t *puVar3;
  uint8_t *target_00;
  void *data;
  uint32_t cached_has_bits;
  V2MessageLite *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  V2MessageLite *this_local;
  
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    value = _internal_int_field(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,value,target);
  }
  if ((uVar1 & 2) != 0) {
    target_00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    value_00 = _internal_enum_field(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (2,value_00,target_00);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL V2MessageLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const V2MessageLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.V2MessageLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 int_field = 1 [features = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_int_field(), target);
  }

  // .proto2_unittest.V2EnumLite enum_field = 2 [default = V2_FIRST];
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, this_._internal_enum_field(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.V2MessageLite)
  return target;
}